

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_filter.c
# Opt level: O3

void * slop_tilde_new(t_symbol *s,int argc,t_atom *argv)

{
  t_object *owner;
  t_float tVar1;
  
  owner = (t_object *)pd_new(slop_tilde_class);
  tVar1 = atom_getfloatarg(0,argc,argv);
  signalinlet_new(owner,tVar1);
  tVar1 = atom_getfloatarg(1,argc,argv);
  signalinlet_new(owner,tVar1);
  tVar1 = atom_getfloatarg(2,argc,argv);
  signalinlet_new(owner,tVar1);
  tVar1 = atom_getfloatarg(3,argc,argv);
  signalinlet_new(owner,tVar1);
  tVar1 = atom_getfloatarg(4,argc,argv);
  signalinlet_new(owner,tVar1);
  outlet_new(owner,&s_signal);
  *(undefined4 *)((long)&owner[1].te_g.g_pd + 4) = 0;
  return owner;
}

Assistant:

static void *slop_tilde_new(t_symbol *s, int argc, t_atom *argv)
{
    t_slop_tilde *x = (t_slop_tilde *)pd_new(slop_tilde_class);
    signalinlet_new(&x->x_obj, atom_getfloatarg(0, argc, argv));
    signalinlet_new(&x->x_obj, atom_getfloatarg(1, argc, argv));
    signalinlet_new(&x->x_obj, atom_getfloatarg(2, argc, argv));
    signalinlet_new(&x->x_obj, atom_getfloatarg(3, argc, argv));
    signalinlet_new(&x->x_obj, atom_getfloatarg(4, argc, argv));
    outlet_new(&x->x_obj, &s_signal);
    x->x_coef = 0;
    return (x);
}